

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey.c
# Opt level: O0

void ssort1(string *x,int n,int depth)

{
  byte bVar1;
  string puVar2;
  int iVar3;
  bool bVar4;
  int local_5c;
  int local_58;
  string t_3;
  string t_2;
  string t_1;
  string t;
  int v;
  int r;
  int d;
  int c;
  int b;
  int a;
  int depth_local;
  int n_local;
  string *x_local;
  
  if (1 < n) {
    iVar3 = rand();
    puVar2 = *x;
    *x = x[iVar3 % n];
    x[iVar3 % n] = puVar2;
    bVar1 = (*x)[depth];
    d = 1;
    c = 1;
    r = n + -1;
    v = r;
    while( true ) {
      while( true ) {
        bVar4 = false;
        if (d <= r) {
          t._4_4_ = (uint)x[d][depth] - (uint)bVar1;
          bVar4 = t._4_4_ < 1;
        }
        if (!bVar4) break;
        if (t._4_4_ == 0) {
          puVar2 = x[c];
          x[c] = x[d];
          x[d] = puVar2;
          c = c + 1;
        }
        d = d + 1;
      }
      while( true ) {
        bVar4 = false;
        if (d <= r) {
          t._4_4_ = (uint)x[r][depth] - (uint)bVar1;
          bVar4 = -1 < t._4_4_;
        }
        if (!bVar4) break;
        if (t._4_4_ == 0) {
          puVar2 = x[r];
          x[r] = x[v];
          x[v] = puVar2;
          v = v + -1;
        }
        r = r + -1;
      }
      if (r < d) break;
      puVar2 = x[d];
      x[d] = x[r];
      x[r] = puVar2;
      d = d + 1;
      r = r + -1;
    }
    if (d - c < c) {
      local_58 = d - c;
    }
    else {
      local_58 = c;
    }
    vecswap(0,d - local_58,local_58,x);
    if ((n - v) + -1 < v - r) {
      local_5c = (n - v) + -1;
    }
    else {
      local_5c = v - r;
    }
    vecswap(d,n - local_5c,local_5c,x);
    iVar3 = d - c;
    ssort1(x,iVar3,depth);
    if (x[iVar3][depth] != '\0') {
      ssort1(x + iVar3,((c + n) - v) + -1,depth + 1);
    }
    ssort1(x + ((long)n - (long)(v - r)),v - r,depth);
  }
  return;
}

Assistant:

static void ssort1(string x[], int n, int depth)
{   int    a, b, c, d, r, v;
    if (n <= 1)
        return;
    a = rand() % n;
    swap(0, a);
    v = i2c(0);
    a = b = 1;
    c = d = n-1;
    for (;;) {
        while (b <= c && (r = i2c(b)-v) <= 0) {
            if (r == 0) { swap(a, b); a++; }
            b++;
        }
        while (b <= c && (r = i2c(c)-v) >= 0) {
            if (r == 0) { swap(c, d); d--; }
            c--;
        }
        if (b > c) break;
        swap(b, c);
        b++;
        c--;
    }
    r = min(a, b-a);     vecswap(0, b-r, r, x);
    r = min(d-c, n-d-1); vecswap(b, n-r, r, x);
    r = b-a; ssort1(x, r, depth);
    if (i2c(r) != 0)
        ssort1(x + r, a + n-d-1, depth+1);
    r = d-c; ssort1(x + n-r, r, depth);
}